

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parse_line_action(parse_state *state,int nargs,char **args)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  listnode *item;
  undefined8 *in_RDX;
  int in_ESI;
  parse_state *in_RDI;
  char *pcVar4;
  int n;
  int kw;
  _func_int_int_char_ptr_ptr *func;
  action *act;
  command *cmd;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  pvVar1 = in_RDI->context;
  if (in_ESI != 0) {
    iVar2 = lookup_keyword((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if ((keyword_info[iVar2].flags & 2) == 0) {
      parse_error(in_RDI,"invalid command \'%s\'\n",*in_RDX);
    }
    else {
      uVar3 = (uint)keyword_info[iVar2].nargs;
      if (in_ESI < (int)uVar3) {
        pcVar4 = "argument";
        if (2 < uVar3) {
          pcVar4 = "arguments";
        }
        parse_error(in_RDI,"%s requires %d %s\n",*in_RDX,(ulong)(uVar3 - 1),pcVar4);
      }
      else {
        item = (listnode *)malloc((long)in_ESI * 8 + 0x28);
        item[1].next = (listnode *)keyword_info[iVar2].func;
        *(int *)&item[1].prev = in_ESI;
        memcpy(item + 2,in_RDX,(long)in_ESI << 3);
        list_add_tail((listnode *)((long)pvVar1 + 0x40),item);
      }
    }
  }
  return;
}

Assistant:

static void parse_line_action(struct parse_state* state, int nargs, char **args)
{
    struct command *cmd;
    struct action *act = state->context;
    int (*func)(int nargs, char **args);
    int kw, n;

    if (nargs == 0) {
        return;
    }

    kw = lookup_keyword(args[0]);
    if (!kw_is(kw, COMMAND)) {
        parse_error(state, "invalid command '%s'\n", args[0]);
        return;
    }

    n = kw_nargs(kw);
    if (nargs < n) {
        parse_error(state, "%s requires %d %s\n", args[0], n - 1,
            n > 2 ? "arguments" : "argument");
        return;
    }
    cmd = malloc(sizeof(*cmd) + sizeof(char*) * nargs);
    cmd->func = kw_func(kw);
    cmd->nargs = nargs;
    memcpy(cmd->args, args, sizeof(char*) * nargs);
    list_add_tail(&act->commands, &cmd->clist);
}